

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-fuzz.cpp
# Opt level: O0

void anon_unknown.dwarf_23886::removeDeadArguments(void)

{
  Function *this;
  bool bVar1;
  int iVar2;
  reference ppFVar3;
  Type *pTVar4;
  Value *RHS;
  WeakTrackingVH *this_00;
  Function *this_01;
  iplist_impl<llvm::simple_ilist<llvm::Function>,_llvm::SymbolTableListTraits<llvm::Function>_>
  *this_02;
  self_iterator where;
  iterator_range<llvm::Argument_*> iVar5;
  StringRef SVar6;
  Twine local_188;
  allocator<char> local_159;
  StringRef local_158;
  undefined1 local_148 [8];
  string FName;
  Function *ClonedFunc;
  Value *local_108;
  Value *local_100;
  Argument *A;
  Argument *__end2;
  Argument *__begin2;
  Argument *local_e0;
  iterator_range<llvm::Argument_*> *local_d8;
  iterator_range<llvm::Argument_*> *__range2;
  vector<llvm::WeakVH,_std::allocator<llvm::WeakVH>_> InstToDelete;
  ValueToValueMapTy VMap;
  Function *F_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<llvm::Function_*,_std::allocator<llvm::Function_*>_> *__range1_1;
  Function *local_50;
  Function *F;
  iterator __end1;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
  local_30;
  iterator __begin1;
  Module *__range1;
  vector<llvm::Function_*,_std::allocator<llvm::Function_*>_> Funcs;
  
  std::vector<llvm::Function_*,_std::allocator<llvm::Function_*>_>::vector
            ((vector<llvm::Function_*,_std::allocator<llvm::Function_*>_> *)&__range1);
  __begin1.NodePtr = (node_pointer)(anonymous_namespace)::M;
  local_30.NodePtr = (node_pointer)llvm::Module::begin((anonymous_namespace)::M);
  F = (Function *)llvm::Module::end((Module *)__begin1.NodePtr);
  while (bVar1 = llvm::operator!=(&local_30,
                                  (ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
                                   *)&F), bVar1) {
    local_50 = llvm::
               ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
               ::operator*(&local_30);
    bVar1 = llvm::Function::arg_empty(local_50);
    if ((!bVar1) && (bVar1 = llvm::Function::isIntrinsic(local_50), !bVar1)) {
      __range1_1 = (vector<llvm::Function_*,_std::allocator<llvm::Function_*>_> *)local_50;
      std::vector<llvm::Function_*,_std::allocator<llvm::Function_*>_>::push_back
                ((vector<llvm::Function_*,_std::allocator<llvm::Function_*>_> *)&__range1,
                 (value_type *)&__range1_1);
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
    ::operator++(&local_30);
  }
  __end1_1 = std::vector<llvm::Function_*,_std::allocator<llvm::Function_*>_>::begin
                       ((vector<llvm::Function_*,_std::allocator<llvm::Function_*>_> *)&__range1);
  F_1 = (Function *)
        std::vector<llvm::Function_*,_std::allocator<llvm::Function_*>_>::end
                  ((vector<llvm::Function_*,_std::allocator<llvm::Function_*>_> *)&__range1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<llvm::Function_**,_std::vector<llvm::Function_*,_std::allocator<llvm::Function_*>_>_>
                        *)&F_1);
    if (!bVar1) break;
    ppFVar3 = __gnu_cxx::
              __normal_iterator<llvm::Function_**,_std::vector<llvm::Function_*,_std::allocator<llvm::Function_*>_>_>
              ::operator*(&__end1_1);
    this = *ppFVar3;
    llvm::
    ValueMap<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>
    ::ValueMap((ValueMap<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>
                *)&InstToDelete.super__Vector_base<llvm::WeakVH,_std::allocator<llvm::WeakVH>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,0x40);
    std::vector<llvm::WeakVH,_std::allocator<llvm::WeakVH>_>::vector
              ((vector<llvm::WeakVH,_std::allocator<llvm::WeakVH>_> *)&__range2);
    iVar5 = llvm::Function::args(this);
    local_e0 = iVar5.end_iterator;
    __begin2 = iVar5.begin_iterator;
    local_d8 = (iterator_range<llvm::Argument_*> *)&__begin2;
    __end2 = llvm::iterator_range<llvm::Argument_*>::begin(local_d8);
    A = llvm::iterator_range<llvm::Argument_*>::end(local_d8);
    for (; __end2 != A; __end2 = __end2 + 0x28) {
      local_100 = (Value *)__end2;
      iVar2 = llvm::Value::getNumUses((Value *)__end2);
      if (iVar2 == 0) {
        pTVar4 = llvm::Value::getType(local_100);
        RHS = (Value *)llvm::UndefValue::get(pTVar4);
        local_108 = local_100;
        this_00 = llvm::
                  ValueMap<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>
                  ::operator[]((ValueMap<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>
                                *)&InstToDelete.
                                   super__Vector_base<llvm::WeakVH,_std::allocator<llvm::WeakVH>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage,&local_108);
        llvm::WeakTrackingVH::operator=(this_00,RHS);
      }
    }
    bVar1 = llvm::
            ValueMap<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>
            ::empty((ValueMap<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>
                     *)&InstToDelete.super__Vector_base<llvm::WeakVH,_std::allocator<llvm::WeakVH>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) {
      this_01 = (Function *)
                llvm::CloneFunction(this,(ValueMap *)
                                         &InstToDelete.
                                          super__Vector_base<llvm::WeakVH,_std::allocator<llvm::WeakVH>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    (ClonedCodeInfo *)0x0);
      llvm::Function::removeFromParent(this_01);
      this_02 = &llvm::Module::getFunctionList((anonymous_namespace)::M)->
                 super_iplist_impl<llvm::simple_ilist<llvm::Function>,_llvm::SymbolTableListTraits<llvm::Function>_>
      ;
      where = llvm::
              ilist_node_impl<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>_>
              ::getIterator((ilist_node_impl<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>_>
                             *)(this + 0x38));
      FName.field_2._8_8_ =
           llvm::
           iplist_impl<llvm::simple_ilist<llvm::Function>,_llvm::SymbolTableListTraits<llvm::Function>_>
           ::insertAfter(this_02,(iterator)where.NodePtr,this_01);
      SVar6 = (StringRef)llvm::Value::getName((Value *)this);
      local_158 = SVar6;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<llvm::StringRef,void>((string *)local_148,&local_158,&local_159);
      std::allocator<char>::~allocator(&local_159);
      llvm::Function::eraseFromParent();
      llvm::Twine::Twine(&local_188,(string *)local_148);
      llvm::Value::setName((Value *)this_01,&local_188);
      std::__cxx11::string::~string((string *)local_148);
    }
    std::vector<llvm::WeakVH,_std::allocator<llvm::WeakVH>_>::~vector
              ((vector<llvm::WeakVH,_std::allocator<llvm::WeakVH>_> *)&__range2);
    llvm::
    ValueMap<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>
    ::~ValueMap((ValueMap<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>
                 *)&InstToDelete.super__Vector_base<llvm::WeakVH,_std::allocator<llvm::WeakVH>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<llvm::Function_**,_std::vector<llvm::Function_*,_std::allocator<llvm::Function_*>_>_>
    ::operator++(&__end1_1);
  }
  std::vector<llvm::Function_*,_std::allocator<llvm::Function_*>_>::~vector
            ((vector<llvm::Function_*,_std::allocator<llvm::Function_*>_> *)&__range1);
  return;
}

Assistant:

void removeDeadArguments() {
  std::vector<Function *> Funcs;
  for (auto &F : *M)
    if (!F.arg_empty() && !F.isIntrinsic())
      Funcs.push_back(&F);

  for (auto *F : Funcs) {
    ValueToValueMapTy VMap;
    std::vector<WeakVH> InstToDelete;
    for (auto &A : F->args())
      if (A.getNumUses() < 1)
        VMap[&A] = UndefValue::get(A.getType());
    
    // No arguments to remove
    if (VMap.empty())
      continue;

    auto *ClonedFunc = CloneFunction(F, VMap);
    ClonedFunc->removeFromParent();
    M->getFunctionList().insertAfter(F->getIterator(), ClonedFunc);

    auto FName = std::string(F->getName());
    F->eraseFromParent();
    ClonedFunc->setName(FName);
  }

}